

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PduContainer.cpp
# Opt level: O0

int __thiscall DIS::PduContainer::getMarshalledSize(PduContainer *this)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined1 local_38 [8];
  Pdu listElement;
  unsigned_long_long idx;
  int marshalSize;
  PduContainer *this_local;
  
  idx._4_4_ = 4;
  listElement.super_PduSuperclass._length = 0;
  listElement.super_PduSuperclass._18_6_ = 0;
  while( true ) {
    uVar1 = listElement.super_PduSuperclass._16_8_;
    sVar3 = std::vector<DIS::Pdu,_std::allocator<DIS::Pdu>_>::size(&this->_pdus);
    if (sVar3 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::Pdu,_std::allocator<DIS::Pdu>_>::operator[]
                       (&this->_pdus,listElement.super_PduSuperclass._16_8_);
    Pdu::Pdu((Pdu *)local_38,pvVar4);
    iVar2 = Pdu::getMarshalledSize((Pdu *)local_38);
    idx._4_4_ = idx._4_4_ + iVar2;
    Pdu::~Pdu((Pdu *)local_38);
    listElement.super_PduSuperclass._16_8_ = listElement.super_PduSuperclass._16_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int PduContainer::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _numberOfPdus

   for(unsigned long long idx=0; idx < _pdus.size(); idx++)
   {
        Pdu listElement = _pdus[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}